

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O0

int __thiscall
boost::runtime::parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true>::clone
          (parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *p;
  int iVar1;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  p = (parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *)
      operator_new(0x120);
  parameter((parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0,_true> *)__fn,
            this);
  iVar1 = (int)this;
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0,true>>
            (in_stack_ffffffffffffffe0,p);
  return iVar1;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new parameter( *this ) );
    }